

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::deinit
          (TextureBufferActiveUniformValidationVSFS *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  if ((this->super_TextureBufferActiveUniformValidation).m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    (this->super_TextureBufferActiveUniformValidation).m_po_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  TextureBufferActiveUniformValidation::deinit(&this->super_TextureBufferActiveUniformValidation);
  return;
}

Assistant:

void TextureBufferActiveUniformValidationVSFS::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (0 != m_po_id)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (0 != m_fs_id)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (0 != m_vs_id)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	/* Call base class' deinit() */
	TextureBufferActiveUniformValidation::deinit();
}